

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s-ref.c
# Opt level: O2

void blake2s_compress(blake2s_state *S,uint8_t *in)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  uint32_t m [16];
  uint32_t local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98 [8];
  int local_78 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78[0xc] = -0x55555556;
  local_78[0xd] = -0x55555556;
  local_78[0xe] = -0x55555556;
  local_78[0xf] = -0x55555556;
  local_78[8] = -0x55555556;
  local_78[9] = -0x55555556;
  local_78[10] = -0x55555556;
  local_78[0xb] = -0x55555556;
  local_78[4] = -0x55555556;
  local_78[5] = -0x55555556;
  local_78[6] = -0x55555556;
  local_78[7] = -0x55555556;
  local_78[0] = -0x55555556;
  local_78[1] = -0x55555556;
  local_78[2] = -0x55555556;
  local_78[3] = -0x55555556;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    local_78[lVar1] = *(int *)(in + lVar1 * 4);
  }
  local_a8 = 0xaaaaaaaa;
  uStack_a4 = 0xaaaaaaaa;
  uStack_a0 = 0xaaaaaaaa;
  uStack_9c = 0xaaaaaaaa;
  local_b8 = 0xaaaaaaaa;
  uStack_b4 = -0x55555556;
  uStack_b0 = -0x55555556;
  uStack_ac = -0x55555556;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    (&local_b8)[lVar1] = S->h[lVar1];
  }
  uVar2 = local_b8 + local_a8 + local_78[0];
  uVar3 = uVar2 ^ S->t[0] ^ 0x510e527f;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_a8 = uVar3 + 0x6a09e667 ^ local_a8;
  uVar4 = local_a8 << 0x14 | local_a8 >> 0xc;
  uVar6 = local_78[1] + uVar2 + uVar4;
  uVar2 = uVar6 ^ uVar3;
  uVar9 = uVar2 << 0x18 | uVar2 >> 8;
  local_98[0] = uVar9 + uVar3 + 0x6a09e667;
  uVar4 = uVar4 ^ local_98[0];
  uVar5 = uVar4 << 0x19 | uVar4 >> 7;
  uVar3 = uStack_b4 + uStack_a4 + local_78[2];
  uVar2 = S->t[1] ^ uVar3 ^ 0x9b05688c;
  uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
  uStack_a4 = uVar2 + 0xbb67ae85 ^ uStack_a4;
  uVar12 = uStack_a4 << 0x14 | uStack_a4 >> 0xc;
  uVar3 = uVar3 + local_78[3] + uVar12;
  uVar4 = uVar3 ^ uVar2;
  uVar7 = uVar4 << 0x18 | uVar4 >> 8;
  local_98[1] = uVar2 + uVar7 + 0xbb67ae85;
  uVar12 = uVar12 ^ local_98[1];
  uVar13 = uVar12 << 0x19 | uVar12 >> 7;
  uVar4 = uStack_b0 + uStack_a0 + local_78[4];
  uVar2 = S->f[0] ^ uVar4 ^ 0x1f83d9ab;
  uVar8 = uVar2 << 0x10 | uVar2 >> 0x10;
  uStack_a0 = uVar8 + 0x3c6ef372 ^ uStack_a0;
  uVar10 = uStack_ac + uStack_9c + local_78[6];
  uVar2 = S->f[1] ^ uVar10 ^ 0x5be0cd19;
  uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
  uStack_9c = uVar2 + 0xa54ff53a ^ uStack_9c;
  uVar12 = uStack_a0 << 0x14 | uStack_a0 >> 0xc;
  uVar14 = uVar4 + local_78[5] + uVar12;
  uVar4 = uVar14 ^ uVar8;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_98[2] = uVar4 + uVar8 + 0x3c6ef372;
  uVar12 = uVar12 ^ local_98[2];
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar8 = uStack_9c << 0x14 | uStack_9c >> 0xc;
  uVar10 = uVar10 + local_78[7] + uVar8;
  uVar11 = uVar10 ^ uVar2;
  uVar11 = uVar11 << 0x18 | uVar11 >> 8;
  local_98[3] = uVar2 + uVar11 + 0xa54ff53a;
  uVar8 = uVar8 ^ local_98[3];
  uVar8 = uVar8 << 0x19 | uVar8 >> 7;
  uVar2 = uVar6 + local_78[8] + uVar13;
  uVar11 = uVar11 ^ uVar2;
  uVar6 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[2] = local_98[2] + uVar6;
  uVar13 = uVar13 ^ local_98[2];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar2 = uVar2 + local_78[9] + uVar13;
  uVar6 = uVar6 ^ uVar2;
  uVar11 = uVar6 << 0x18 | uVar6 >> 8;
  local_98[2] = local_98[2] + uVar11;
  uVar13 = uVar13 ^ local_98[2];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar3 = uVar3 + local_78[10] + uVar12;
  uVar9 = uVar9 ^ uVar3;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[3] = local_98[3] + uVar9;
  uVar12 = uVar12 ^ local_98[3];
  uVar6 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar3 = uVar3 + local_78[0xb] + uVar6;
  uVar9 = uVar9 ^ uVar3;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_98[3] = local_98[3] + uVar9;
  uVar6 = uVar6 ^ local_98[3];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar14 = uVar14 + local_78[0xc] + uVar8;
  uVar7 = uVar7 ^ uVar14;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_98[0] = local_98[0] + uVar7;
  uVar8 = uVar8 ^ local_98[0];
  uVar12 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar14 = uVar14 + local_78[0xd] + uVar12;
  uVar7 = uVar7 ^ uVar14;
  uVar8 = uVar7 << 0x18 | uVar7 >> 8;
  local_98[0] = local_98[0] + uVar8;
  uVar12 = uVar12 ^ local_98[0];
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar7 = uVar10 + local_78[0xe] + uVar5;
  uVar4 = uVar4 ^ uVar7;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_98[1] = local_98[1] + uVar4;
  uVar5 = uVar5 ^ local_98[1];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar10 = uVar7 + local_78[0xf] + uVar5;
  uVar4 = uVar4 ^ uVar10;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_98[1] = local_98[1] + uVar4;
  uVar5 = uVar5 ^ local_98[1];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar2 = uVar2 + local_78[0xe] + uVar5;
  uVar9 = uVar9 ^ uVar2;
  uVar7 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[0] = local_98[0] + uVar7;
  uVar5 = uVar5 ^ local_98[0];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_78[10] + uVar5;
  uVar7 = uVar7 ^ uVar2;
  uVar9 = uVar7 << 0x18 | uVar7 >> 8;
  local_98[0] = local_98[0] + uVar9;
  uVar5 = uVar5 ^ local_98[0];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar3 = uVar3 + local_78[4] + uVar13;
  uVar8 = uVar8 ^ uVar3;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[1] = local_98[1] + uVar8;
  uVar13 = uVar13 ^ local_98[1];
  uVar7 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar3 = uVar3 + local_78[8] + uVar7;
  uVar8 = uVar8 ^ uVar3;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_98[1] = local_98[1] + uVar8;
  uVar7 = uVar7 ^ local_98[1];
  uVar13 = uVar7 << 0x19 | uVar7 >> 7;
  uVar7 = uVar14 + local_78[9] + uVar6;
  uVar4 = uVar4 ^ uVar7;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_98[2] = local_98[2] + uVar4;
  uVar6 = uVar6 ^ local_98[2];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar14 = uVar7 + local_78[0xf] + uVar6;
  uVar4 = uVar4 ^ uVar14;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_98[2] = local_98[2] + uVar4;
  uVar6 = uVar6 ^ local_98[2];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar7 = uVar10 + local_78[0xd] + uVar12;
  uVar11 = uVar11 ^ uVar7;
  uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[3] = local_98[3] + uVar11;
  uVar12 = uVar12 ^ local_98[3];
  uVar12 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar10 = uVar7 + local_78[6] + uVar12;
  uVar11 = uVar11 ^ uVar10;
  uVar7 = uVar11 << 0x18 | uVar11 >> 8;
  local_98[3] = local_98[3] + uVar7;
  uVar12 = uVar12 ^ local_98[3];
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar2 = uVar2 + local_78[1] + uVar13;
  uVar7 = uVar7 ^ uVar2;
  uVar11 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_98[2] = local_98[2] + uVar11;
  uVar13 = uVar13 ^ local_98[2];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar7 = uVar2 + local_78[0xc] + uVar13;
  uVar11 = uVar11 ^ uVar7;
  uVar11 = uVar11 << 0x18 | uVar11 >> 8;
  local_98[2] = local_98[2] + uVar11;
  uVar13 = uVar13 ^ local_98[2];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar2 = uVar3 + local_78[0] + uVar6;
  uVar9 = uVar9 ^ uVar2;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[3] = local_98[3] + uVar9;
  uVar6 = uVar6 ^ local_98[3];
  uVar3 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar2 = uVar2 + local_78[2] + uVar3;
  uVar9 = uVar9 ^ uVar2;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_98[3] = local_98[3] + uVar9;
  uVar3 = uVar3 ^ local_98[3];
  uVar6 = uVar3 << 0x19 | uVar3 >> 7;
  uVar14 = uVar14 + local_78[0xb] + uVar12;
  uVar8 = uVar8 ^ uVar14;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[0] = local_98[0] + uVar8;
  uVar12 = uVar12 ^ local_98[0];
  uVar3 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar14 = uVar14 + local_78[7] + uVar3;
  uVar8 = uVar8 ^ uVar14;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_98[0] = local_98[0] + uVar8;
  uVar3 = uVar3 ^ local_98[0];
  uVar12 = uVar3 << 0x19 | uVar3 >> 7;
  uVar10 = uVar10 + local_78[5] + uVar5;
  uVar4 = uVar4 ^ uVar10;
  uVar3 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_98[1] = local_98[1] + uVar3;
  uVar5 = uVar5 ^ local_98[1];
  uVar4 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar10 = uVar10 + local_78[3] + uVar4;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[1] = local_98[1] + uVar3;
  uVar4 = uVar4 ^ local_98[1];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar5 = uVar7 + local_78[0xb] + uVar4;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[0] = local_98[0] + uVar9;
  uVar4 = uVar4 ^ local_98[0];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar7 = uVar5 + local_78[8] + uVar4;
  uVar9 = uVar9 ^ uVar7;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_98[0] = local_98[0] + uVar9;
  uVar4 = uVar4 ^ local_98[0];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar2 = uVar2 + local_78[0xc] + uVar13;
  uVar8 = uVar8 ^ uVar2;
  uVar5 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[1] = local_98[1] + uVar5;
  uVar13 = uVar13 ^ local_98[1];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar2 = uVar2 + local_78[0] + uVar13;
  uVar5 = uVar5 ^ uVar2;
  uVar8 = uVar5 << 0x18 | uVar5 >> 8;
  local_98[1] = local_98[1] + uVar8;
  uVar13 = uVar13 ^ local_98[1];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar14 = uVar14 + local_78[5] + uVar6;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_98[2] = local_98[2] + uVar3;
  uVar6 = uVar6 ^ local_98[2];
  uVar5 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar14 = uVar14 + local_78[2] + uVar5;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[2] = local_98[2] + uVar3;
  uVar5 = uVar5 ^ local_98[2];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar10 = uVar10 + local_78[0xf] + uVar12;
  uVar11 = uVar11 ^ uVar10;
  uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[3] = local_98[3] + uVar11;
  uVar12 = uVar12 ^ local_98[3];
  uVar6 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar10 = uVar10 + local_78[0xd] + uVar6;
  uVar11 = uVar11 ^ uVar10;
  uVar11 = uVar11 << 0x18 | uVar11 >> 8;
  local_98[3] = local_98[3] + uVar11;
  uVar6 = uVar6 ^ local_98[3];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar12 = uVar7 + local_78[10] + uVar13;
  uVar11 = uVar11 ^ uVar12;
  uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[2] = local_98[2] + uVar11;
  uVar13 = uVar13 ^ local_98[2];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar7 = uVar12 + local_78[0xe] + uVar13;
  uVar11 = uVar11 ^ uVar7;
  uVar11 = uVar11 << 0x18 | uVar11 >> 8;
  local_98[2] = local_98[2] + uVar11;
  uVar13 = uVar13 ^ local_98[2];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar2 = uVar2 + local_78[3] + uVar5;
  uVar9 = uVar9 ^ uVar2;
  uVar12 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[3] = local_98[3] + uVar12;
  uVar5 = uVar5 ^ local_98[3];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_78[6] + uVar5;
  uVar12 = uVar12 ^ uVar2;
  uVar9 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[3] = local_98[3] + uVar9;
  uVar5 = uVar5 ^ local_98[3];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar14 = uVar14 + local_78[7] + uVar6;
  uVar8 = uVar8 ^ uVar14;
  uVar12 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[0] = local_98[0] + uVar12;
  uVar6 = uVar6 ^ local_98[0];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar14 = uVar14 + local_78[1] + uVar6;
  uVar12 = uVar12 ^ uVar14;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[0] = local_98[0] + uVar12;
  uVar6 = uVar6 ^ local_98[0];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar8 = uVar10 + local_78[9] + uVar4;
  uVar3 = uVar3 ^ uVar8;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_98[1] = local_98[1] + uVar3;
  uVar4 = uVar4 ^ local_98[1];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar10 = uVar8 + local_78[4] + uVar4;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[1] = local_98[1] + uVar3;
  uVar4 = uVar4 ^ local_98[1];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar8 = uVar7 + local_78[7] + uVar4;
  uVar9 = uVar9 ^ uVar8;
  uVar7 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[0] = local_98[0] + uVar7;
  uVar4 = uVar4 ^ local_98[0];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar8 = uVar8 + local_78[9] + uVar4;
  uVar7 = uVar7 ^ uVar8;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_98[0] = local_98[0] + uVar7;
  uVar4 = uVar4 ^ local_98[0];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar2 = uVar2 + local_78[3] + uVar13;
  uVar12 = uVar12 ^ uVar2;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_98[1] = local_98[1] + uVar12;
  uVar13 = uVar13 ^ local_98[1];
  uVar9 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar2 = uVar2 + local_78[1] + uVar9;
  uVar12 = uVar12 ^ uVar2;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[1] = local_98[1] + uVar12;
  uVar9 = uVar9 ^ local_98[1];
  uVar13 = uVar9 << 0x19 | uVar9 >> 7;
  uVar9 = uVar14 + local_78[0xd] + uVar5;
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_98[2] = local_98[2] + uVar3;
  uVar5 = uVar5 ^ local_98[2];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar14 = uVar9 + local_78[0xc] + uVar5;
  uVar3 = uVar3 ^ uVar14;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[2] = local_98[2] + uVar3;
  uVar5 = uVar5 ^ local_98[2];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar9 = uVar10 + local_78[0xb] + uVar6;
  uVar11 = uVar11 ^ uVar9;
  uVar10 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[3] = local_98[3] + uVar10;
  uVar6 = uVar6 ^ local_98[3];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar9 = uVar9 + local_78[0xe] + uVar6;
  uVar10 = uVar10 ^ uVar9;
  uVar10 = uVar10 << 0x18 | uVar10 >> 8;
  local_98[3] = local_98[3] + uVar10;
  uVar6 = uVar6 ^ local_98[3];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar8 = uVar8 + local_78[2] + uVar13;
  uVar10 = uVar10 ^ uVar8;
  uVar10 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_98[2] = local_98[2] + uVar10;
  uVar13 = uVar13 ^ local_98[2];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar8 = uVar8 + local_78[6] + uVar13;
  uVar10 = uVar10 ^ uVar8;
  uVar11 = uVar10 << 0x18 | uVar10 >> 8;
  local_98[2] = local_98[2] + uVar11;
  uVar13 = uVar13 ^ local_98[2];
  uVar13 = uVar13 << 0x19 | uVar13 >> 7;
  uVar2 = uVar2 + local_78[5] + uVar5;
  uVar7 = uVar7 ^ uVar2;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_98[3] = local_98[3] + uVar7;
  uVar5 = uVar5 ^ local_98[3];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_78[10] + uVar5;
  uVar7 = uVar7 ^ uVar2;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_98[3] = local_98[3] + uVar7;
  uVar5 = uVar5 ^ local_98[3];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar10 = uVar14 + local_78[4] + uVar6;
  uVar12 = uVar12 ^ uVar10;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_98[0] = local_98[0] + uVar12;
  uVar6 = uVar6 ^ local_98[0];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar15 = uVar10 + local_78[0] + uVar6;
  uVar12 = uVar12 ^ uVar15;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[0] = local_98[0] + uVar12;
  uVar6 = uVar6 ^ local_98[0];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar9 = uVar9 + local_78[0xf] + uVar4;
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_98[1] = local_98[1] + uVar3;
  uVar4 = uVar4 ^ local_98[1];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar10 = uVar9 + local_78[8] + uVar4;
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[1] = local_98[1] + uVar3;
  uVar4 = uVar4 ^ local_98[1];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar8 = uVar8 + local_78[9] + uVar4;
  uVar7 = uVar7 ^ uVar8;
  uVar9 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_98[0] = local_98[0] + uVar9;
  uVar4 = uVar4 ^ local_98[0];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar7 = uVar8 + local_78[0] + uVar4;
  uVar9 = uVar9 ^ uVar7;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_98[0] = local_98[0] + uVar9;
  uVar4 = uVar4 ^ local_98[0];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar2 = uVar2 + local_78[5] + uVar13;
  uVar12 = uVar12 ^ uVar2;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_98[1] = local_98[1] + uVar12;
  uVar13 = uVar13 ^ local_98[1];
  uVar13 = uVar13 << 0x14 | uVar13 >> 0xc;
  uVar2 = uVar2 + local_78[7] + uVar13;
  uVar12 = uVar12 ^ uVar2;
  uVar8 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[1] = local_98[1] + uVar8;
  uVar13 = uVar13 ^ local_98[1];
  uVar14 = uVar13 << 0x19 | uVar13 >> 7;
  uVar12 = uVar15 + local_78[2] + uVar5;
  uVar3 = uVar3 ^ uVar12;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_98[2] = local_98[2] + uVar3;
  uVar5 = uVar5 ^ local_98[2];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar10 = uVar10 + local_78[10] + uVar6;
  uVar11 = uVar11 ^ uVar10;
  uVar15 = uVar12 + local_78[4] + uVar5;
  uVar3 = uVar3 ^ uVar15;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[2] = local_98[2] + uVar3;
  uVar5 = uVar5 ^ local_98[2];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar13 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[3] = local_98[3] + uVar13;
  uVar6 = uVar6 ^ local_98[3];
  uVar12 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar11 = uVar10 + local_78[0xf] + uVar12;
  uVar13 = uVar13 ^ uVar11;
  uVar10 = uVar13 << 0x18 | uVar13 >> 8;
  local_98[3] = local_98[3] + uVar10;
  uVar12 = uVar12 ^ local_98[3];
  uVar6 = uVar7 + local_78[0xe] + uVar14;
  uVar10 = uVar10 ^ uVar6;
  uVar13 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_98[2] = local_98[2] + uVar13;
  uVar14 = uVar14 ^ local_98[2];
  uVar14 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar7 = uVar6 + local_78[1] + uVar14;
  uVar13 = uVar13 ^ uVar7;
  uVar2 = uVar2 + local_78[0xb] + uVar5;
  uVar9 = uVar9 ^ uVar2;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[3] = local_98[3] + uVar9;
  uVar5 = uVar5 ^ local_98[3];
  uVar6 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_78[0xc] + uVar6;
  uVar9 = uVar9 ^ uVar2;
  uVar10 = uVar9 << 0x18 | uVar9 >> 8;
  uVar9 = uVar11 + local_78[3] + uVar4;
  uVar3 = uVar3 ^ uVar9;
  uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_98[1] = local_98[1] + uVar3;
  uVar4 = uVar4 ^ local_98[1];
  uVar5 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar11 = uVar9 + local_78[0xd] + uVar5;
  uVar3 = uVar3 ^ uVar11;
  uVar4 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[1] = local_98[1] + uVar4;
  uVar5 = uVar5 ^ local_98[1];
  uVar3 = uVar5 << 0x19 | uVar5 >> 7;
  local_98[3] = local_98[3] + uVar10;
  uVar9 = uVar7 + local_78[2] + uVar3;
  uVar10 = uVar10 ^ uVar9;
  uVar5 = uVar12 << 0x19 | uVar12 >> 7;
  uVar13 = uVar13 << 0x18 | uVar13 >> 8;
  local_98[2] = local_98[2] + uVar13;
  uVar14 = uVar14 ^ local_98[2];
  uVar14 = uVar14 << 0x19 | uVar14 >> 7;
  uVar7 = uVar15 + local_78[6] + uVar5;
  uVar8 = uVar8 ^ uVar7;
  uVar12 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[0] = local_98[0] + uVar12;
  uVar5 = uVar5 ^ local_98[0];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar8 = uVar7 + local_78[8] + uVar5;
  uVar12 = uVar12 ^ uVar8;
  uVar7 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[0] = local_98[0] + uVar7;
  uVar2 = uVar2 + local_78[6] + uVar14;
  uVar7 = uVar7 ^ uVar2;
  uVar6 = uVar6 ^ local_98[3];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar15 = uVar8 + local_78[0] + uVar6;
  uVar4 = uVar4 ^ uVar15;
  uVar5 = uVar5 ^ local_98[0];
  uVar8 = uVar5 << 0x19 | uVar5 >> 7;
  uVar11 = uVar11 + local_78[8] + uVar8;
  uVar13 = uVar13 ^ uVar11;
  uVar10 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_98[0] = local_98[0] + uVar10;
  uVar3 = uVar3 ^ local_98[0];
  uVar5 = uVar3 << 0x14 | uVar3 >> 0xc;
  uVar12 = uVar9 + local_78[0xc] + uVar5;
  uVar10 = uVar10 ^ uVar12;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_98[1] = local_98[1] + uVar7;
  uVar14 = uVar14 ^ local_98[1];
  uVar9 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar3 = uVar2 + local_78[10] + uVar9;
  uVar7 = uVar7 ^ uVar3;
  uVar7 = uVar7 << 0x18 | uVar7 >> 8;
  local_98[1] = local_98[1] + uVar7;
  uVar9 = uVar9 ^ local_98[1];
  uVar14 = uVar9 << 0x19 | uVar9 >> 7;
  uVar2 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_98[3] = local_98[3] + uVar2;
  uVar8 = uVar8 ^ local_98[3];
  uVar8 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar13 = uVar11 + local_78[3] + uVar8;
  uVar2 = uVar2 ^ uVar13;
  uVar9 = uVar2 << 0x18 | uVar2 >> 8;
  local_98[3] = local_98[3] + uVar9;
  uVar12 = uVar12 + local_78[4] + uVar14;
  uVar9 = uVar9 ^ uVar12;
  uVar2 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_98[2] = local_98[2] + uVar2;
  uVar6 = uVar6 ^ local_98[2];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar15 = uVar15 + local_78[0xb] + uVar6;
  uVar2 = uVar2 ^ uVar15;
  uVar4 = uVar2 << 0x18 | uVar2 >> 8;
  local_98[2] = local_98[2] + uVar4;
  uVar6 = uVar6 ^ local_98[2];
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[2] = local_98[2] + uVar9;
  uVar14 = uVar14 ^ local_98[2];
  uVar14 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar2 = uVar12 + local_78[0xd] + uVar14;
  uVar9 = uVar9 ^ uVar2;
  uVar11 = uVar9 << 0x18 | uVar9 >> 8;
  local_98[2] = uVar11 + local_98[2];
  uVar12 = uVar10 << 0x18 | uVar10 >> 8;
  local_98[0] = local_98[0] + uVar12;
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar8 = uVar8 ^ local_98[3];
  uVar14 = uVar14 ^ local_98[2];
  uVar14 = uVar14 << 0x19 | uVar14 >> 7;
  uVar3 = uVar3 + uVar6 + local_78[7];
  uVar12 = uVar12 ^ uVar3;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_98[3] = local_98[3] + uVar12;
  uVar6 = uVar6 ^ local_98[3];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar3 = uVar3 + local_78[5] + uVar6;
  uVar12 = uVar12 ^ uVar3;
  uVar9 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[3] = local_98[3] + uVar9;
  uVar6 = local_98[3] ^ uVar6;
  uVar5 = uVar5 ^ local_98[0];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar12 = uVar8 << 0x19 | uVar8 >> 7;
  uVar8 = uVar13 + local_78[1] + uVar5;
  uVar4 = uVar4 ^ uVar8;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_98[1] = local_98[1] + uVar4;
  uVar5 = uVar5 ^ local_98[1];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar15 = uVar15 + local_78[0xf] + uVar12;
  uVar13 = uVar8 + uVar5 + local_78[9];
  uVar7 = uVar7 ^ uVar15;
  uVar4 = uVar4 ^ uVar13;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_98[1] = local_98[1] + uVar4;
  uVar5 = uVar5 ^ local_98[1];
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar2 = uVar2 + local_78[0xc] + uVar5;
  uVar9 = uVar9 ^ uVar2;
  uVar10 = uVar6 << 0x19 | uVar6 >> 7;
  uVar8 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_98[0] = local_98[0] + uVar8;
  uVar12 = uVar12 ^ local_98[0];
  uVar6 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar15 = uVar15 + local_78[0xe] + uVar6;
  uVar8 = uVar8 ^ uVar15;
  uVar12 = uVar8 << 0x18 | uVar8 >> 8;
  local_98[0] = local_98[0] + uVar12;
  uVar6 = uVar6 ^ local_98[0];
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar8 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[0] = local_98[0] + uVar8;
  uVar5 = uVar5 ^ local_98[0];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar2 = uVar2 + local_78[5] + uVar5;
  uVar8 = uVar8 ^ uVar2;
  uVar9 = uVar8 << 0x18 | uVar8 >> 8;
  local_98[0] = uVar9 + local_98[0];
  uVar5 = local_98[0] ^ uVar5;
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar3 = uVar3 + uVar14 + local_78[1];
  uVar12 = uVar12 ^ uVar3;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_98[1] = local_98[1] + uVar12;
  uVar14 = uVar14 ^ local_98[1];
  uVar7 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar3 = uVar3 + local_78[0xf] + uVar7;
  uVar12 = uVar12 ^ uVar3;
  uVar8 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[1] = uVar8 + local_98[1];
  uVar7 = local_98[1] ^ uVar7;
  uVar12 = uVar7 << 0x19 | uVar7 >> 7;
  uVar14 = uVar15 + uVar10 + local_78[0xe];
  uVar4 = uVar4 ^ uVar14;
  uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_98[2] = local_98[2] + uVar4;
  uVar10 = uVar10 ^ local_98[2];
  uVar7 = uVar10 << 0x14 | uVar10 >> 0xc;
  uVar15 = uVar14 + uVar7 + local_78[0xd];
  uVar4 = uVar4 ^ uVar15;
  uVar4 = uVar4 << 0x18 | uVar4 >> 8;
  local_98[2] = uVar4 + local_98[2];
  uVar7 = uVar7 ^ local_98[2];
  uVar10 = uVar7 << 0x19 | uVar7 >> 7;
  uVar13 = uVar13 + uVar6 + local_78[4];
  uVar11 = uVar11 ^ uVar13;
  uVar7 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[3] = local_98[3] + uVar7;
  uVar6 = uVar6 ^ local_98[3];
  uVar6 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar14 = uVar13 + uVar6 + local_78[10];
  uVar7 = uVar7 ^ uVar14;
  uVar11 = uVar7 << 0x18 | uVar7 >> 8;
  local_98[3] = local_98[3] + uVar11;
  uVar6 = uVar6 ^ local_98[3];
  uVar7 = uVar6 << 0x19 | uVar6 >> 7;
  uVar2 = uVar2 + uVar12 + local_78[0];
  uVar11 = uVar11 ^ uVar2;
  uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[2] = local_98[2] + uVar11;
  uVar12 = uVar12 ^ local_98[2];
  uVar6 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar2 = uVar2 + uVar6 + local_78[7];
  uVar11 = uVar11 ^ uVar2;
  uVar13 = uVar11 << 0x18 | uVar11 >> 8;
  local_98[2] = uVar13 + local_98[2];
  uVar6 = local_98[2] ^ uVar6;
  uVar6 = uVar6 << 0x19 | uVar6 >> 7;
  uVar3 = uVar3 + uVar10 + local_78[6];
  uVar9 = uVar9 ^ uVar3;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[3] = local_98[3] + uVar9;
  uVar10 = uVar10 ^ local_98[3];
  uVar12 = uVar10 << 0x14 | uVar10 >> 0xc;
  uVar3 = uVar3 + uVar12 + local_78[3];
  uVar9 = uVar9 ^ uVar3;
  uVar10 = uVar9 << 0x18 | uVar9 >> 8;
  local_98[3] = local_98[3] + uVar10;
  uVar12 = local_98[3] ^ uVar12;
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar9 = uVar15 + uVar7 + local_78[9];
  uVar8 = uVar8 ^ uVar9;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[0] = local_98[0] + uVar8;
  uVar7 = uVar7 ^ local_98[0];
  uVar7 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar15 = uVar9 + uVar7 + local_78[2];
  uVar8 = uVar8 ^ uVar15;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  local_98[0] = local_98[0] + uVar8;
  uVar7 = uVar7 ^ local_98[0];
  uVar7 = uVar7 << 0x19 | uVar7 >> 7;
  uVar11 = uVar14 + uVar5 + local_78[8];
  uVar4 = uVar4 ^ uVar11;
  uVar9 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_98[1] = local_98[1] + uVar9;
  uVar5 = uVar5 ^ local_98[1];
  uVar4 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar14 = uVar11 + local_78[0xb] + uVar4;
  uVar9 = uVar9 ^ uVar14;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  local_98[1] = local_98[1] + uVar9;
  uVar4 = uVar4 ^ local_98[1];
  uVar4 = uVar4 << 0x19 | uVar4 >> 7;
  uVar2 = uVar2 + uVar4 + local_78[0xd];
  uVar10 = uVar10 ^ uVar2;
  uVar5 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_98[0] = local_98[0] + uVar5;
  uVar4 = uVar4 ^ local_98[0];
  uVar4 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar2 = uVar2 + local_78[0xb] + uVar4;
  uVar5 = uVar5 ^ uVar2;
  uVar10 = uVar5 << 0x18 | uVar5 >> 8;
  local_98[0] = uVar10 + local_98[0];
  uVar4 = local_98[0] ^ uVar4;
  uVar11 = uVar4 << 0x19 | uVar4 >> 7;
  uVar3 = uVar3 + uVar6 + local_78[7];
  uVar8 = uVar8 ^ uVar3;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[1] = local_98[1] + uVar8;
  uVar6 = uVar6 ^ local_98[1];
  uVar5 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar4 = uVar3 + uVar5 + local_78[0xe];
  uVar8 = uVar8 ^ uVar4;
  uVar6 = uVar8 << 0x18 | uVar8 >> 8;
  local_98[1] = uVar6 + local_98[1];
  uVar5 = local_98[1] ^ uVar5;
  uVar3 = uVar5 << 0x19 | uVar5 >> 7;
  uVar15 = uVar15 + uVar12 + local_78[0xc];
  uVar9 = uVar9 ^ uVar15;
  uVar5 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[2] = local_98[2] + uVar5;
  uVar12 = uVar12 ^ local_98[2];
  uVar8 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar16 = uVar15 + uVar8 + local_78[1];
  uVar5 = uVar5 ^ uVar16;
  uVar12 = uVar5 << 0x18 | uVar5 >> 8;
  local_98[2] = uVar12 + local_98[2];
  uVar8 = uVar8 ^ local_98[2];
  uVar9 = uVar8 << 0x19 | uVar8 >> 7;
  uVar14 = uVar14 + uVar7 + local_78[3];
  uVar13 = uVar13 ^ uVar14;
  uVar8 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_98[3] = local_98[3] + uVar8;
  uVar7 = uVar7 ^ local_98[3];
  uVar5 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar15 = uVar14 + uVar5 + local_78[9];
  uVar8 = uVar8 ^ uVar15;
  uVar7 = uVar8 << 0x18 | uVar8 >> 8;
  local_98[3] = local_98[3] + uVar7;
  uVar5 = uVar5 ^ local_98[3];
  uVar8 = uVar5 << 0x19 | uVar5 >> 7;
  uVar2 = uVar2 + uVar3 + local_78[5];
  uVar7 = uVar7 ^ uVar2;
  uVar7 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_98[2] = local_98[2] + uVar7;
  uVar3 = uVar3 ^ local_98[2];
  uVar5 = uVar3 << 0x14 | uVar3 >> 0xc;
  uVar3 = uVar2 + uVar5 + local_78[0];
  uVar7 = uVar7 ^ uVar3;
  uVar14 = uVar7 << 0x18 | uVar7 >> 8;
  local_98[2] = uVar14 + local_98[2];
  uVar5 = local_98[2] ^ uVar5;
  uVar2 = uVar5 << 0x19 | uVar5 >> 7;
  uVar4 = uVar4 + local_78[0xf] + uVar9;
  uVar10 = uVar10 ^ uVar4;
  uVar7 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_98[3] = local_98[3] + uVar7;
  uVar9 = uVar9 ^ local_98[3];
  uVar5 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar4 = uVar4 + uVar5 + local_78[4];
  uVar7 = uVar7 ^ uVar4;
  uVar13 = uVar7 << 0x18 | uVar7 >> 8;
  local_98[3] = local_98[3] + uVar13;
  uVar5 = local_98[3] ^ uVar5;
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar9 = uVar16 + uVar8 + local_78[8];
  uVar6 = uVar6 ^ uVar9;
  uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_98[0] = local_98[0] + uVar6;
  uVar8 = uVar8 ^ local_98[0];
  uVar7 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar16 = uVar9 + local_78[6] + uVar7;
  uVar6 = uVar6 ^ uVar16;
  uVar8 = uVar6 << 0x18 | uVar6 >> 8;
  local_98[0] = local_98[0] + uVar8;
  uVar7 = uVar7 ^ local_98[0];
  uVar9 = uVar7 << 0x19 | uVar7 >> 7;
  uVar7 = uVar15 + uVar11 + local_78[2];
  uVar12 = uVar12 ^ uVar7;
  uVar6 = uVar12 << 0x10 | uVar12 >> 0x10;
  local_98[1] = local_98[1] + uVar6;
  uVar11 = uVar11 ^ local_98[1];
  uVar12 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar15 = uVar7 + uVar12 + local_78[10];
  uVar6 = uVar6 ^ uVar15;
  uVar10 = uVar6 << 0x18 | uVar6 >> 8;
  local_98[1] = local_98[1] + uVar10;
  uVar12 = uVar12 ^ local_98[1];
  uVar6 = uVar12 << 0x19 | uVar12 >> 7;
  uVar3 = local_78[6] + uVar6 + uVar3;
  uVar13 = uVar13 ^ uVar3;
  uVar12 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_98[0] = local_98[0] + uVar12;
  uVar6 = uVar6 ^ local_98[0];
  uVar7 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar6 = uVar3 + local_78[0xf] + uVar7;
  uVar12 = uVar12 ^ uVar6;
  uVar13 = uVar12 << 0x18 | uVar12 >> 8;
  local_98[0] = uVar13 + local_98[0];
  uVar7 = local_98[0] ^ uVar7;
  uVar11 = uVar7 << 0x19 | uVar7 >> 7;
  uVar3 = uVar4 + uVar2 + local_78[0xe];
  uVar8 = uVar8 ^ uVar3;
  uVar4 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[1] = local_98[1] + uVar4;
  uVar2 = uVar2 ^ local_98[1];
  uVar2 = uVar2 << 0x14 | uVar2 >> 0xc;
  uVar3 = uVar3 + uVar2 + local_78[9];
  uVar4 = uVar4 ^ uVar3;
  uVar7 = uVar4 << 0x18 | uVar4 >> 8;
  local_98[1] = uVar7 + local_98[1];
  uVar2 = local_98[1] ^ uVar2;
  uVar12 = uVar2 << 0x19 | uVar2 >> 7;
  uVar8 = uVar16 + uVar5 + local_78[0xb];
  uVar10 = uVar10 ^ uVar8;
  uVar4 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_98[2] = local_98[2] + uVar4;
  uVar5 = uVar5 ^ local_98[2];
  uVar2 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar16 = uVar8 + uVar2 + local_78[3];
  uVar4 = uVar4 ^ uVar16;
  uVar10 = uVar4 << 0x18 | uVar4 >> 8;
  local_98[2] = uVar10 + local_98[2];
  uVar2 = uVar2 ^ local_98[2];
  uVar4 = uVar2 << 0x19 | uVar2 >> 7;
  uVar8 = uVar15 + uVar9 + local_78[0];
  uVar14 = uVar14 ^ uVar8;
  uVar5 = uVar14 << 0x10 | uVar14 >> 0x10;
  local_98[3] = local_98[3] + uVar5;
  uVar9 = uVar9 ^ local_98[3];
  uVar2 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar14 = uVar8 + uVar2 + local_78[8];
  uVar5 = uVar5 ^ uVar14;
  uVar5 = uVar5 << 0x18 | uVar5 >> 8;
  local_98[3] = local_98[3] + uVar5;
  uVar2 = uVar2 ^ local_98[3];
  uVar9 = uVar2 << 0x19 | uVar2 >> 7;
  uVar2 = uVar6 + uVar12 + local_78[0xc];
  uVar5 = uVar5 ^ uVar2;
  uVar6 = uVar5 << 0x10 | uVar5 >> 0x10;
  local_98[2] = local_98[2] + uVar6;
  uVar12 = uVar12 ^ local_98[2];
  uVar5 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar12 = uVar2 + uVar5 + local_78[2];
  uVar6 = uVar6 ^ uVar12;
  uVar8 = uVar6 << 0x18 | uVar6 >> 8;
  local_98[2] = uVar8 + local_98[2];
  uVar5 = local_98[2] ^ uVar5;
  uVar2 = uVar5 << 0x19 | uVar5 >> 7;
  uVar3 = uVar3 + uVar4 + local_78[0xd];
  uVar13 = uVar13 ^ uVar3;
  uVar6 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_98[3] = local_98[3] + uVar6;
  uVar4 = uVar4 ^ local_98[3];
  uVar5 = uVar4 << 0x14 | uVar4 >> 0xc;
  uVar4 = uVar3 + uVar5 + local_78[7];
  uVar6 = uVar6 ^ uVar4;
  uVar13 = uVar6 << 0x18 | uVar6 >> 8;
  local_98[3] = local_98[3] + uVar13;
  uVar5 = local_98[3] ^ uVar5;
  uVar6 = uVar5 << 0x19 | uVar5 >> 7;
  uVar15 = uVar16 + uVar9 + local_78[1];
  uVar7 = uVar7 ^ uVar15;
  uVar3 = uVar7 << 0x10 | uVar7 >> 0x10;
  local_98[0] = local_98[0] + uVar3;
  uVar9 = uVar9 ^ local_98[0];
  uVar5 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar15 = uVar15 + local_78[4] + uVar5;
  uVar3 = uVar3 ^ uVar15;
  uVar9 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[0] = local_98[0] + uVar9;
  uVar5 = uVar5 ^ local_98[0];
  uVar7 = uVar5 << 0x19 | uVar5 >> 7;
  uVar5 = uVar14 + uVar11 + local_78[10];
  uVar10 = uVar10 ^ uVar5;
  uVar3 = uVar10 << 0x10 | uVar10 >> 0x10;
  local_98[1] = local_98[1] + uVar3;
  uVar11 = uVar11 ^ local_98[1];
  uVar10 = uVar11 << 0x14 | uVar11 >> 0xc;
  uVar14 = uVar5 + uVar10 + local_78[5];
  uVar3 = uVar3 ^ uVar14;
  uVar11 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[1] = local_98[1] + uVar11;
  uVar10 = uVar10 ^ local_98[1];
  uVar5 = uVar10 << 0x19 | uVar10 >> 7;
  uVar12 = local_78[10] + uVar5 + uVar12;
  uVar13 = uVar13 ^ uVar12;
  uVar3 = uVar13 << 0x10 | uVar13 >> 0x10;
  local_98[0] = local_98[0] + uVar3;
  uVar5 = uVar5 ^ local_98[0];
  uVar5 = uVar5 << 0x14 | uVar5 >> 0xc;
  uVar10 = uVar12 + uVar5 + local_78[2];
  uVar3 = uVar3 ^ uVar10;
  uVar3 = uVar3 << 0x18 | uVar3 >> 8;
  local_98[0] = uVar3 + local_98[0];
  uVar5 = local_98[0] ^ uVar5;
  uVar5 = uVar5 << 0x19 | uVar5 >> 7;
  uVar4 = uVar4 + uVar2 + local_78[8];
  uVar9 = uVar9 ^ uVar4;
  uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
  local_98[1] = local_98[1] + uVar9;
  uVar2 = uVar2 ^ local_98[1];
  uVar2 = uVar2 << 0x14 | uVar2 >> 0xc;
  uVar12 = uVar4 + local_78[4] + uVar2;
  uVar9 = uVar9 ^ uVar12;
  uVar4 = uVar9 << 0x18 | uVar9 >> 8;
  local_98[1] = uVar4 + local_98[1];
  uVar2 = local_98[1] ^ uVar2;
  uVar9 = uVar2 << 0x19 | uVar2 >> 7;
  uVar13 = uVar15 + uVar6 + local_78[7];
  uVar11 = uVar11 ^ uVar13;
  uVar2 = uVar11 << 0x10 | uVar11 >> 0x10;
  local_98[2] = local_98[2] + uVar2;
  uVar6 = uVar6 ^ local_98[2];
  uVar11 = uVar6 << 0x14 | uVar6 >> 0xc;
  uVar15 = uVar13 + uVar11 + local_78[6];
  uVar2 = uVar2 ^ uVar15;
  uVar6 = uVar2 << 0x18 | uVar2 >> 8;
  uVar13 = uVar14 + uVar7 + local_78[1];
  uVar8 = uVar8 ^ uVar13;
  uVar2 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_98[3] = local_98[3] + uVar2;
  uVar7 = uVar7 ^ local_98[3];
  uVar8 = uVar7 << 0x14 | uVar7 >> 0xc;
  uVar13 = uVar13 + uVar8 + local_78[5];
  local_98[2] = uVar6 + local_98[2];
  uVar2 = uVar2 ^ uVar13;
  uVar2 = uVar2 << 0x18 | uVar2 >> 8;
  uVar11 = uVar11 ^ local_98[2];
  uVar10 = uVar10 + uVar9 + local_78[0xf];
  local_98[3] = local_98[3] + uVar2;
  uVar2 = uVar2 ^ uVar10;
  uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
  local_98[2] = local_98[2] + uVar2;
  uVar9 = uVar9 ^ local_98[2];
  uVar7 = uVar9 << 0x14 | uVar9 >> 0xc;
  local_b8 = uVar10 + uVar7 + local_78[0xb];
  uVar2 = local_b8 ^ uVar2;
  local_98[7] = uVar2 << 0x18 | uVar2 >> 8;
  local_98[2] = local_98[7] + local_98[2];
  uVar9 = uVar11 << 0x19 | uVar11 >> 7;
  uVar7 = local_98[2] ^ uVar7;
  uVar8 = uVar8 ^ local_98[3];
  uStack_a4 = uVar7 << 0x19 | uVar7 >> 7;
  uVar12 = uVar12 + uVar9 + local_78[9];
  uVar3 = uVar3 ^ uVar12;
  uVar2 = uVar3 << 0x10 | uVar3 >> 0x10;
  local_98[3] = local_98[3] + uVar2;
  uVar9 = uVar9 ^ local_98[3];
  uVar3 = uVar9 << 0x14 | uVar9 >> 0xc;
  uStack_b4 = uVar12 + uVar3 + local_78[0xe];
  uVar2 = uStack_b4 ^ uVar2;
  local_98[4] = uVar2 << 0x18 | uVar2 >> 8;
  local_98[3] = local_98[4] + local_98[3];
  uVar12 = uVar8 << 0x19 | uVar8 >> 7;
  uVar3 = local_98[3] ^ uVar3;
  uStack_a0 = uVar3 << 0x19 | uVar3 >> 7;
  uVar8 = uVar15 + uVar12 + local_78[3];
  uVar4 = uVar4 ^ uVar8;
  uVar2 = uVar4 << 0x10 | uVar4 >> 0x10;
  local_98[0] = local_98[0] + uVar2;
  uVar12 = uVar12 ^ local_98[0];
  uVar3 = uVar12 << 0x14 | uVar12 >> 0xc;
  uStack_b0 = uVar8 + uVar3 + local_78[0xc];
  uVar2 = uStack_b0 ^ uVar2;
  local_98[5] = uVar2 << 0x18 | uVar2 >> 8;
  local_98[0] = local_98[5] + local_98[0];
  uVar3 = local_98[0] ^ uVar3;
  uStack_9c = uVar3 << 0x19 | uVar3 >> 7;
  uVar4 = uVar13 + uVar5 + local_78[0xd];
  uVar6 = uVar6 ^ uVar4;
  uVar3 = uVar6 << 0x10 | uVar6 >> 0x10;
  local_98[1] = local_98[1] + uVar3;
  uVar5 = uVar5 ^ local_98[1];
  uVar2 = uVar5 << 0x14 | uVar5 >> 0xc;
  uStack_ac = uVar4 + uVar2 + local_78[0];
  uVar3 = uStack_ac ^ uVar3;
  local_98[6] = uVar3 << 0x18 | uVar3 >> 8;
  local_98[1] = local_98[6] + local_98[1];
  uVar2 = local_98[1] ^ uVar2;
  local_a8 = uVar2 << 0x19 | uVar2 >> 7;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    S->h[lVar1] = (&local_b8)[lVar1] ^ S->h[lVar1] ^ local_98[lVar1];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blake2s_compress( blake2s_state *S, const uint8_t in[BLAKE2S_BLOCKBYTES] )
{
  uint32_t m[16];
  uint32_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load32( in + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2s_IV[0];
  v[ 9] = blake2s_IV[1];
  v[10] = blake2s_IV[2];
  v[11] = blake2s_IV[3];
  v[12] = S->t[0] ^ blake2s_IV[4];
  v[13] = S->t[1] ^ blake2s_IV[5];
  v[14] = S->f[0] ^ blake2s_IV[6];
  v[15] = S->f[1] ^ blake2s_IV[7];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}